

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Renderer.cpp
# Opt level: O2

Vector3f __thiscall
Renderer::colorPath(Renderer *this,float tmin,Object3D *light,
                   vector<Ray,_std::allocator<Ray>_> *eye_path,
                   vector<Hit,_std::allocator<Hit>_> *eye_hits,
                   vector<Ray,_std::allocator<Ray>_> *light_path,
                   vector<Hit,_std::allocator<Hit>_> *light_hits)

{
  unsigned_long j;
  float *overallDensity_00;
  unsigned_long i;
  ulong light_length;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  Vector3f VVar2;
  vector<Hit,_std::allocator<Hit>_> *in_stack_00000008;
  float overallDensity;
  vector<Vector3f,_std::allocator<Vector3f>_> light_bsdf;
  vector<Vector3f,_std::allocator<Vector3f>_> eye_bsdf;
  vector<float,_std::allocator<float>_> light_pdfs;
  vector<float,_std::allocator<float>_> eye_pdfs;
  Vector3f intensity;
  float fVar1;
  
  eye_pdfs.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  eye_pdfs.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  eye_pdfs.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  light_pdfs.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  light_pdfs.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  light_pdfs.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  eye_bsdf.super__Vector_base<Vector3f,_std::allocator<Vector3f>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  eye_bsdf.super__Vector_base<Vector3f,_std::allocator<Vector3f>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  eye_bsdf.super__Vector_base<Vector3f,_std::allocator<Vector3f>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  light_bsdf.super__Vector_base<Vector3f,_std::allocator<Vector3f>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  light_bsdf.super__Vector_base<Vector3f,_std::allocator<Vector3f>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  light_bsdf.super__Vector_base<Vector3f,_std::allocator<Vector3f>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  if (2 < (ulong)(((long)(eye_hits->super__Vector_base<Hit,_std::allocator<Hit>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(eye_hits->super__Vector_base<Hit,_std::allocator<Hit>_>)._M_impl.
                        super__Vector_impl_data._M_start) / 0x18)) {
    precomputeCumulativeBSDF
              ((Renderer *)light,(vector<Ray,_std::allocator<Ray>_> *)eye_hits,
               (vector<Hit,_std::allocator<Hit>_> *)light_path,&eye_bsdf,&eye_pdfs);
  }
  if (2 < (ulong)(((long)(light_hits->super__Vector_base<Hit,_std::allocator<Hit>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(light_hits->super__Vector_base<Hit,_std::allocator<Hit>_>)._M_impl.
                        super__Vector_impl_data._M_start) / 0x18)) {
    precomputeCumulativeBSDF
              ((Renderer *)light,(vector<Ray,_std::allocator<Ray>_> *)light_hits,in_stack_00000008,
               &light_bsdf,&light_pdfs);
  }
  Vector3f::Vector3f(&intensity,0.0);
  for (light_length = 2;
      light_length <=
      (ulong)(((long)(eye_hits->super__Vector_base<Hit,_std::allocator<Hit>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
              (long)(eye_hits->super__Vector_base<Hit,_std::allocator<Hit>_>)._M_impl.
                    super__Vector_impl_data._M_start) / 0x18); light_length = light_length + 1) {
    for (overallDensity_00 = (float *)0x1;
        overallDensity_00 <=
        (float *)(((long)(light_hits->super__Vector_base<Hit,_std::allocator<Hit>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(light_hits->super__Vector_base<Hit,_std::allocator<Hit>_>)._M_impl.
                        super__Vector_impl_data._M_start) / 0x18);
        overallDensity_00 = (float *)((long)overallDensity_00 + 1)) {
      colorPathCombination
                ((Renderer *)&stack0xffffffffffffffc4,tmin,light,eye_path,eye_hits,
                 (vector<Vector3f,_std::allocator<Vector3f>_> *)light_path,
                 (vector<float,_std::allocator<float>_> *)&eye_bsdf,
                 (vector<Ray,_std::allocator<Ray>_> *)&eye_pdfs,light_hits,
                 (vector<Vector3f,_std::allocator<Vector3f>_> *)in_stack_00000008,
                 (vector<float,_std::allocator<float>_> *)&light_bsdf,(unsigned_long)&light_pdfs,
                 light_length,overallDensity_00);
      Vector3f::operator+=(&intensity,(Vector3f *)&stack0xffffffffffffffc4);
    }
  }
  VVar2 = operator/((Vector3f *)this,0.0);
  fVar1 = VVar2.m_elements[2];
  std::_Vector_base<Vector3f,_std::allocator<Vector3f>_>::~_Vector_base
            (&light_bsdf.super__Vector_base<Vector3f,_std::allocator<Vector3f>_>);
  std::_Vector_base<Vector3f,_std::allocator<Vector3f>_>::~_Vector_base
            (&eye_bsdf.super__Vector_base<Vector3f,_std::allocator<Vector3f>_>);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&light_pdfs.super__Vector_base<float,_std::allocator<float>_>);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&eye_pdfs.super__Vector_base<float,_std::allocator<float>_>);
  VVar2.m_elements[1] = (float)extraout_XMM0_Db;
  VVar2.m_elements[0] = (float)extraout_XMM0_Da;
  VVar2.m_elements[2] = fVar1;
  return (Vector3f)VVar2.m_elements;
}

Assistant:

Vector3f Renderer::colorPath(float tmin, Object3D *light, const std::vector<Ray> &eye_path, std::vector<Hit> &eye_hits,
                             const std::vector<Ray> &light_path, std::vector<Hit> &light_hits) {

    // First, pre-compute the BSDF and weights for each component of the paths.
    std::vector<float> eye_pdfs, light_pdfs;
    std::vector<Vector3f> eye_bsdf, light_bsdf;
    if (eye_path.size() > 2) {
        precomputeCumulativeBSDF(eye_path, eye_hits, eye_bsdf, eye_pdfs);
    }
    if (light_path.size() > 2) {
        precomputeCumulativeBSDF(light_path, light_hits, light_bsdf, light_pdfs);
    }

    // For each combination, find the intensity; average once all are found.
    Vector3f intensity;
    float overallDensity = 0;
    for (unsigned long i = 2; i <= eye_path.size(); i++) {
        for (unsigned long j = 1; j <= light_path.size(); j++) {
            intensity += colorPathCombination(tmin, light, eye_path, eye_hits, eye_bsdf, eye_pdfs, light_path,
                                              light_hits, light_bsdf, light_pdfs, i, j, overallDensity);
        }
    }
    return intensity / overallDensity;
}